

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O1

void __thiscall
LongReadsMapper::LongReadsMapper
          (LongReadsMapper *this,SequenceDistanceGraph *_sdg,LongReadsDatastore *ds,uint8_t k,
          bool sat_index)

{
  this->sg = _sdg;
  this->max_index_freq = 200;
  this->k = k;
  this->min_size = 1000;
  this->min_chain = 0x32;
  this->max_jump = 500;
  this->max_hits_to_candidate = 4;
  this->max_delta_change = 0x3c;
  this->min_number_of_node_occurrences = 0x32;
  this->datastore = ds;
  (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->all_paths_between)._M_h._M_buckets = &(this->all_paths_between)._M_h._M_single_bucket;
  (this->all_paths_between)._M_h._M_bucket_count = 1;
  (this->all_paths_between)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->all_paths_between)._M_h._M_element_count = 0;
  (this->all_paths_between)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->all_paths_between)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->all_paths_between)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->read_paths).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->read_paths).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->read_paths).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->reads_in_node).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reads_in_node).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reads_in_node).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->sat_kmer_index = sat_index;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->reads_in_node,
           ((long)(_sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(_sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  return;
}

Assistant:

LongReadsMapper::LongReadsMapper(const SequenceDistanceGraph &_sdg, const LongReadsDatastore &ds, uint8_t k, bool sat_index)
        : sg(_sdg), k(k), datastore(ds), sat_kmer_index(sat_index) {
    reads_in_node.resize(sg.nodes.size());
}